

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

int __thiscall Poller::Mod(Poller *this,PollObj *po,int op)

{
  int __epfd;
  uint uVar1;
  int __fd;
  undefined1 local_28 [8];
  epoll_event ev;
  int op_local;
  PollObj *po_local;
  Poller *this_local;
  
  ev.data.fd = op;
  unique0x1000009a = po;
  memset(local_28,0,0xc);
  stack0xffffffffffffffdc = stack0xffffffffffffffe8;
  uVar1 = local_28._0_4_ | 0x2018;
  if ((ev.data.u32 & 1) != 0) {
    uVar1 = local_28._0_4_ | 0x2019;
  }
  local_28._0_4_ = uVar1;
  if ((ev.data.u32 & 2) != 0) {
    local_28._0_4_ = local_28._0_4_ | 4;
  }
  if ((ev.data.u32 & 0x10) != 0) {
    local_28._0_4_ = local_28._0_4_ | 0x80000000;
  }
  __epfd = this->context->epollfd;
  __fd = (*stack0xffffffffffffffe8->_vptr_PollObj[2])();
  epoll_ctl(__epfd,3,__fd,(epoll_event *)local_28);
  return 0;
}

Assistant:

int Poller::Mod(PollObj* po, int op) {
    struct epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    ev.data.ptr = (void*)(po);
    ev.events |= EPOLLERR | EPOLLHUP | EPOLLRDHUP;
    if(op & EV_READ)
        ev.events |= EPOLLIN;
    if(op & EV_WRITE)
        ev.events |= EPOLLOUT;
    if(op & EV_ET)
        ev.events |= EPOLLET;
    epoll_ctl(context->epollfd, EPOLL_CTL_MOD, po->GetSockFd(), &ev);

    return 0;
}